

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NRooks.cpp
# Opt level: O0

void __thiscall pm::NRooks::generateSamples(NRooks *this)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  Random *this_00;
  float fVar4;
  float fVar5;
  Vector2 local_20;
  Vector2 sp;
  uint i;
  uint p;
  NRooks *this_local;
  
  for (sp.y = 0.0; (uint)sp.y < (this->super_Sampler).numSets_; sp.y = (float)((int)sp.y + 1)) {
    for (sp.x = 0.0; (uint)sp.x < (this->super_Sampler).numSamples_; sp.x = (float)((int)sp.x + 1))
    {
      uVar2 = (ulong)(uint)sp.x;
      this_00 = &(this->super_Sampler).rnd_;
      fVar4 = Random::real(this_00);
      uVar1 = (this->super_Sampler).numSamples_;
      uVar3 = (ulong)(uint)sp.x;
      fVar5 = Random::real(this_00);
      Vector2::Vector2(&local_20,((float)uVar2 + fVar4) / (float)uVar1,
                       ((float)uVar3 + fVar5) / (float)(this->super_Sampler).numSamples_);
      std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::push_back
                (&(this->super_Sampler).samples_,&local_20);
    }
  }
  shuffleXCoords(this);
  shuffleYCoords(this);
  return;
}

Assistant:

void NRooks::generateSamples()
{
	for (unsigned int p = 0; p < numSets_; p++)
		for (unsigned int i = 0; i < numSamples_; i++)
		{
			const Vector2 sp((i + rnd_.real()) / numSamples_, (i + rnd_.real()) / numSamples_);
			samples_.push_back(sp);
		}

	shuffleXCoords();
	shuffleYCoords();
}